

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleFillTest::render
          (TriangleFillTest *this,Context *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  TestLog *pTVar2;
  Context *pCVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec4 *extraout_RDX;
  Vec4 *p;
  Vec4 *p_00;
  Vec4 *extraout_RDX_00;
  Vec4 *extraout_RDX_01;
  Vec4 *extraout_RDX_02;
  Vec4 *extraout_RDX_03;
  Vec4 *p_01;
  ulong uVar7;
  long lVar8;
  pointer pFVar9;
  string v2Properties;
  string v1Properties;
  string v0Properties;
  PositionColorShader program;
  string local_370;
  string local_350;
  string local_330;
  Context *local_310;
  undefined1 local_308 [120];
  ios_base local_290 [264];
  ShaderProgram local_188;
  
  PositionColorShader::PositionColorShader((PositionColorShader *)&local_188);
  uVar4 = (*ctx->_vptr_Context[0x75])(ctx,&local_188);
  uVar5 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar4,"a_position");
  uVar6 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar4,"a_color");
  pTVar2 = ((this->super_FillTest).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
           .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_308 + 8);
  local_308._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Viewport: left=",0xf);
  std::ostream::operator<<(poVar1,(this->super_FillTest).m_viewport.left);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tbottom=",8);
  std::ostream::operator<<(poVar1,(this->super_FillTest).m_viewport.bottom);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\twidth=",7);
  std::ostream::operator<<(poVar1,(this->super_FillTest).m_viewport.width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\theight=",8);
  std::ostream::operator<<(poVar1,(this->super_FillTest).m_viewport.height);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_310 = ctx;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_290);
  poVar1 = (ostringstream *)(local_308 + 8);
  local_308._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering triangles. Coordinates:",0x21);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_290);
  pFVar9 = (this->m_triangles).
           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_triangles).
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar9) {
    poVar1 = (ostringstream *)(local_308 + 8);
    this_00 = (ostringstream *)(local_308 + 8);
    this_01 = (ostringstream *)(local_308 + 8);
    lVar8 = 0;
    uVar7 = 0;
    p_01 = extraout_RDX;
    do {
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)((long)(pFVar9->v0).m_data + lVar8),p_01);
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_350,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_triangles).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v1).m_data + lVar8),p);
      Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
                (&local_370,
                 (_anonymous_namespace_ *)
                 ((long)(((this->m_triangles).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v2).m_data + lVar8),p_00);
      local_308._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tv0 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                   lVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                   lVar8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                   lVar8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                   lVar8 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_330._M_dataplus._M_p,local_330._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_290);
      local_308._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tv1 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v1).m_data +
                                   lVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v1).m_data +
                                   lVar8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v1).m_data +
                                   lVar8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v1).m_data +
                                   lVar8 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,local_350._M_dataplus._M_p,local_350._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_290);
      local_308._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tv2 (x=",7);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v2).m_data +
                                   lVar8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\ty=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v2).m_data +
                                   lVar8 + 4));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tz=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v2).m_data +
                                   lVar8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tw=",3);
      std::ostream::_M_insert<double>
                ((double)*(float *)((long)(((this->m_triangles).
                                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->v2).m_data +
                                   lVar8 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,")\t",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_370._M_dataplus._M_p,local_370._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base(local_290);
      local_308._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_308 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_308 + 8));
      std::ios_base::~ios_base(local_290);
      p_01 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        p_01 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        p_01 = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        p_01 = extraout_RDX_03;
      }
      uVar7 = uVar7 + 1;
      pFVar9 = (this->m_triangles).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x60;
    } while (uVar7 < (ulong)(((long)(this->m_triangles).
                                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar9 >> 5)
                            * -0x5555555555555555));
  }
  pCVar3 = local_310;
  (*local_310->_vptr_Context[0x2a])(0,0,0,0x3f800000,local_310);
  (*pCVar3->_vptr_Context[0x2b])(0x3f800000,pCVar3);
  (*pCVar3->_vptr_Context[0x2d])(pCVar3,0x4100);
  (*pCVar3->_vptr_Context[5])
            (pCVar3,(ulong)(uint)(this->super_FillTest).m_viewport.left,
             (ulong)(uint)(this->super_FillTest).m_viewport.bottom,
             (ulong)(uint)(this->super_FillTest).m_viewport.width,
             (ulong)(uint)(this->super_FillTest).m_viewport.height);
  (*pCVar3->_vptr_Context[0x76])(pCVar3,(ulong)uVar4);
  (*pCVar3->_vptr_Context[0x41])(pCVar3,1,1);
  (*pCVar3->_vptr_Context[0x33])(pCVar3,0xbe2);
  (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar5);
  (*pCVar3->_vptr_Context[0x50])(pCVar3,(ulong)uVar6);
  (*pCVar3->_vptr_Context[0x4e])
            (pCVar3,(ulong)uVar5,4,0x1406,0,0x20,
             (this->m_triangles).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start);
  (*pCVar3->_vptr_Context[0x4e])
            (pCVar3,(ulong)uVar6,4,0x1406,0,0x20,
             &((this->m_triangles).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start)->c0);
  (*pCVar3->_vptr_Context[0x68])
            (pCVar3,4,0,
             (ulong)((long)(this->m_triangles).
                           super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_triangles).
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
  (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar5);
  (*pCVar3->_vptr_Context[0x51])(pCVar3,(ulong)uVar6);
  (*pCVar3->_vptr_Context[0x76])(pCVar3,0);
  (*pCVar3->_vptr_Context[0x77])(pCVar3,(ulong)uVar4);
  (*pCVar3->_vptr_Context[0x7a])(pCVar3);
  sglr::ShaderProgram::~ShaderProgram(&local_188);
  return;
}

Assistant:

void TriangleFillTest::render (sglr::Context& ctx)
{
	const int			verticesPerTriangle		= 3;
	PositionColorShader program;
	const deUint32		programId				= ctx.createProgram(&program);
	const GLint			positionLoc				= ctx.getAttribLocation(programId, "a_position");
	const GLint			colorLoc				= ctx.getAttribLocation(programId, "a_color");
	tcu::TestLog&		log						= m_testCtx.getLog();

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_triangles.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_triangles[ndx].v0);
		const std::string v1Properties = genClippingPointInfoString(m_triangles[ndx].v1);
		const std::string v2Properties = genClippingPointInfoString(m_triangles[ndx].v2);

		log << TestLog::Message << "\tv0 (x=" << m_triangles[ndx].v0.x() << "\ty=" << m_triangles[ndx].v0.y() << "\tz=" << m_triangles[ndx].v0.z() << "\tw=" << m_triangles[ndx].v0.w() << ")\t" << v0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_triangles[ndx].v1.x() << "\ty=" << m_triangles[ndx].v1.y() << "\tz=" << m_triangles[ndx].v1.z() << "\tw=" << m_triangles[ndx].v1.w() << ")\t" << v1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_triangles[ndx].v2.x() << "\ty=" << m_triangles[ndx].v2.y() << "\tz=" << m_triangles[ndx].v2.z() << "\tw=" << m_triangles[ndx].v2.w() << ")\t" << v2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	ctx.clearColor					(0, 0, 0, 1);
	ctx.clearDepthf					(1.0f);
	ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
	ctx.useProgram					(programId);
	ctx.blendFunc					(GL_ONE, GL_ONE);
	ctx.enable						(GL_BLEND);
	ctx.enableVertexAttribArray		(positionLoc);
	ctx.enableVertexAttribArray		(colorLoc);
	ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].v0);
	ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].c0);
	ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_triangles.size());
	ctx.disableVertexAttribArray	(positionLoc);
	ctx.disableVertexAttribArray	(colorLoc);
	ctx.useProgram					(0);
	ctx.deleteProgram				(programId);
	ctx.finish						();
}